

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderInit(SortSubtask *pTask,SorterFile *pFile,i64 iStart,PmaReader *pReadr,i64 *pnByte)

{
  long lVar1;
  int iVar2;
  PmaReader *in_RCX;
  SortSubtask *in_RDX;
  PmaReader *in_R8;
  long in_FS_OFFSET;
  int rc;
  u64 nByte;
  uint in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = vdbePmaReaderSeek(in_RDX,in_RCX,(SorterFile *)in_R8,
                            CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc0));
  if (iVar2 == 0) {
    iVar2 = vdbePmaReadVarint(in_R8,(u64 *)(ulong)in_stack_ffffffffffffffc0);
    in_RCX->iEof = in_RCX->iReadOff;
    in_R8->iReadOff = in_R8->iReadOff;
  }
  if (iVar2 == 0) {
    iVar2 = vdbePmaReaderNext(in_R8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbePmaReaderInit(
  SortSubtask *pTask,             /* Task context */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iStart,                     /* Start offset in pFile */
  PmaReader *pReadr,              /* PmaReader to populate */
  i64 *pnByte                     /* IN/OUT: Increment this value by PMA size */
){
  int rc;

  assert( pFile->iEof>iStart );
  assert( pReadr->aAlloc==0 && pReadr->nAlloc==0 );
  assert( pReadr->aBuffer==0 );
  assert( pReadr->aMap==0 );

  rc = vdbePmaReaderSeek(pTask, pReadr, pFile, iStart);
  if( rc==SQLITE_OK ){
    u64 nByte = 0;                 /* Size of PMA in bytes */
    rc = vdbePmaReadVarint(pReadr, &nByte);
    pReadr->iEof = pReadr->iReadOff + nByte;
    *pnByte += nByte;
  }

  if( rc==SQLITE_OK ){
    rc = vdbePmaReaderNext(pReadr);
  }
  return rc;
}